

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nh_hall.hpp
# Opt level: O0

Stereo __thiscall nh_ugens::RandomLFO::process(RandomLFO *this)

{
  float fVar1;
  uint16_t uVar2;
  float fVar3;
  float fVar4;
  Stereo SVar5;
  RandomLFO *this_local;
  Stereo result;
  
  if (this->m_timeout < 1) {
    uVar2 = run_lcg(this);
    this->m_timeout =
         (int)(((((float)uVar2 * 0.1) / this->m_frequency) * this->m_sample_rate) / 48000.0);
    uVar2 = run_lcg(this);
    this->m_increment =
         (((float)uVar2 * 3.051851e-05 + -0.5) * this->m_frequency) / this->m_sample_rate;
  }
  this->m_timeout = this->m_timeout + -1;
  this->m_phase = this->m_phase + this->m_increment;
  fVar3 = sinf(this->m_phase);
  fVar1 = this->m_amplitude;
  fVar4 = cosf(this->m_phase);
  SVar5._M_elems[0] = fVar3 * fVar1;
  SVar5._M_elems[1] = fVar4 * this->m_amplitude;
  return (Stereo)SVar5._M_elems;
}

Assistant:

Stereo process(void) {
        if (m_timeout <= 0) {
            m_timeout = run_lcg() * 0.1f / m_frequency * m_sample_rate / 48000.0f;
            m_increment = (run_lcg() * (1.0f / 32767.0f) - 0.5f) * m_frequency / m_sample_rate;
        }
        m_timeout -= 1;
        m_phase += m_increment;
        // TODO: optimize
        Stereo result = {{
            sinf(m_phase) * m_amplitude,
            cosf(m_phase) * m_amplitude
        }};
        return result;
    }